

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O1

void __thiscall
NJamSpell::TBloomFilter::TBloomFilter(TBloomFilter *this,uint64_t elements,double falsePositiveRate)

{
  _Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false> _Var1;
  _Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false> this_00;
  ulong uVar2;
  pointer *__ptr;
  undefined1 local_68 [8];
  bloom_parameters parameters;
  
  (this->BloomFilter)._M_t.
  super___uniq_ptr_impl<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_NJamSpell::TBloomFilter::Impl_*,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
  .super__Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false>._M_head_impl = (Impl *)0x0;
  local_68 = (undefined1  [8])&PTR__bloom_parameters_0014bbd0;
  parameters._vptr_bloom_parameters = (_func_int **)0x1;
  parameters.minimum_size = 0xffffffffffffffff;
  parameters.maximum_size = 0xffffffff00000001;
  parameters.random_seed._0_4_ = 0;
  parameters.optimal_parameters.number_of_hashes = 0;
  parameters.optimal_parameters._4_4_ = 0;
  parameters.false_positive_probability = 2.07507571253324e-322;
  parameters._24_8_ = elements;
  parameters.projected_element_count = (unsigned_long_long)falsePositiveRate;
  bloom_parameters::compute_optimal_parameters((bloom_parameters *)local_68);
  if ((((parameters._vptr_bloom_parameters <= parameters.minimum_size) &&
       ((int)parameters.maximum_size - 1U < parameters.maximum_size._4_4_)) &&
      (parameters._24_8_ != 0)) &&
     ((uVar2 = parameters.projected_element_count & 0x7fffffffffffffff,
      (0x3fe < (uint)(uVar2 + 0xfff0000000000000 >> 0x35) ||
      -1 < (long)parameters.projected_element_count) &&
      (uVar2 != 0x7ff0000000000000 &&
      (0xffffffffffffe < uVar2 - 1 || -1 < (long)parameters.projected_element_count)) &&
      (1 < (long)parameters.false_positive_probability + 1U)))) {
    this_00._M_head_impl = (Impl *)operator_new(0x68);
    bloom_filter::bloom_filter((bloom_filter *)this_00._M_head_impl,(bloom_parameters *)local_68);
    ((this_00._M_head_impl)->super_bloom_filter)._vptr_bloom_filter = &PTR__bloom_filter_0014bb38;
    _Var1._M_head_impl =
         (this->BloomFilter)._M_t.
         super___uniq_ptr_impl<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_NJamSpell::TBloomFilter::Impl_*,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
         .super__Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false>._M_head_impl;
    (this->BloomFilter)._M_t.
    super___uniq_ptr_impl<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_NJamSpell::TBloomFilter::Impl_*,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
    .super__Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false>._M_head_impl =
         this_00._M_head_impl;
    if (_Var1._M_head_impl != (Impl *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_bloom_filter + 8))();
    }
    return;
  }
  __assert_fail("!(!parameters)",
                "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/bloom_filter.cpp"
                ,0x25,"NJamSpell::TBloomFilter::TBloomFilter(uint64_t, double)");
}

Assistant:

TBloomFilter::TBloomFilter(uint64_t elements, double falsePositiveRate) {
    bloom_parameters parameters;
    parameters.projected_element_count = elements;
    parameters.false_positive_probability = falsePositiveRate;
    parameters.random_seed = 42;
    parameters.compute_optimal_parameters();
    assert(!(!parameters));
    BloomFilter.reset(new TBloomFilter::Impl(parameters));
}